

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::clearData(KCPServer *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  KCPServer *this_local;
  
  Mutex::lock(&(this->super_Server).super_Runnable.m_msgMutex);
  while( true ) {
    bVar1 = std::
            queue<net_uv::NetThreadMsg,_std::deque<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>_>
            ::empty(&(this->super_Server).super_Runnable.m_msgQue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar2 = std::
             queue<net_uv::NetThreadMsg,_std::deque<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>_>
             ::front(&(this->super_Server).super_Runnable.m_msgQue);
    if (pvVar2->data != (char *)0x0) {
      pvVar2 = std::
               queue<net_uv::NetThreadMsg,_std::deque<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>_>
               ::front(&(this->super_Server).super_Runnable.m_msgQue);
      free(pvVar2->data);
    }
    std::
    queue<net_uv::NetThreadMsg,_std::deque<net_uv::NetThreadMsg,_std::allocator<net_uv::NetThreadMsg>_>_>
    ::pop(&(this->super_Server).super_Runnable.m_msgQue);
  }
  Mutex::unlock(&(this->super_Server).super_Runnable.m_msgMutex);
  while( true ) {
    bVar1 = std::
            queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
            ::empty(&(this->super_Server).super_SessionManager.m_operationQue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::
             queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
             ::front(&(this->super_Server).super_SessionManager.m_operationQue);
    if (pvVar3->operationType == 1) {
      pvVar3 = std::
               queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
               ::front(&(this->super_Server).super_SessionManager.m_operationQue);
      free(pvVar3->operationData);
    }
    std::
    queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
    ::pop(&(this->super_Server).super_SessionManager.m_operationQue);
  }
  return;
}

Assistant:

void KCPServer::clearData()
{
	m_msgMutex.lock();
	while (!m_msgQue.empty())
	{
		if (m_msgQue.front().data)
		{
			fc_free(m_msgQue.front().data);
		}
		m_msgQue.pop();
	}
	m_msgMutex.unlock();
	while (!m_operationQue.empty())
	{
		if (m_operationQue.front().operationType == KCP_SVR_OP_SEND_DATA)
		{
			fc_free(m_operationQue.front().operationData);
		}
		m_operationQue.pop();
	}
}